

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

string * __thiscall
kratos::VarDuplicated::to_string_abi_cxx11_(string *__return_storage_ptr__,VarDuplicated *this)

{
  _func_int *p_Var1;
  Var *pVVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  shared_ptr<kratos::Expr> sVar3;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98 [2];
  char *local_88;
  size_type sStack_80;
  undefined1 local_70 [8];
  shared_ptr<kratos::Expr> expr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_50;
  char *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_38;
  
  if (((this->super_Expr).left)->type_ == Expression) {
    sVar3 = Var::as<kratos::Expr>((Var *)local_70);
    p_Var1 = *(_func_int **)((long)local_70 + 0x270);
    if (p_Var1 == (_func_int *)0x1c) {
      pVVar2 = (this->super_Expr).right;
      (*(pVVar2->super_IRNode)._vptr_IRNode[0x1f])
                (&expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 pVVar2,sVar3.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._M_pi);
      (*(((this->super_Expr).left)->super_IRNode)._vptr_IRNode[0x1f])(&local_40);
      local_98[0] = expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
      local_88 = local_40;
      sStack_80 = aStack_38._M_allocated_capacity;
      format_str.size_ = 0xdd;
      format_str.data_ = (char *)0xa;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_98;
      fmt::v7::detail::vformat_abi_cxx11_
                (__return_storage_ptr__,(detail *)"{{{0}{1}}}",format_str,args);
      if (local_40 != aStack_38._M_local_buf + 8) {
        operator_delete(local_40,aStack_38._8_8_ + 1);
      }
      if (expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          &local_50) {
        operator_delete(expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi,(long)local_50._vptr__Sp_counted_base + 1);
      }
    }
    if (expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (p_Var1 == (_func_int *)0x1c) {
      return __return_storage_ptr__;
    }
  }
  (*(((this->super_Expr).right)->super_IRNode)._vptr_IRNode[0x1f])
            (&expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (*(((this->super_Expr).left)->super_IRNode)._vptr_IRNode[0x1f])(&local_40);
  local_98[0] = expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_88 = local_40;
  sStack_80 = aStack_38._M_allocated_capacity;
  format_str_00.size_ = 0xdd;
  format_str_00.data_ = (char *)0xe;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_98;
  fmt::v7::detail::vformat_abi_cxx11_
            (__return_storage_ptr__,(detail *)"{{{0}{{{1}}}}}",format_str_00,args_00);
  if (local_40 != aStack_38._M_local_buf + 8) {
    operator_delete(local_40,aStack_38._8_8_ + 1);
  }
  if (expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      &local_50) {
    operator_delete(expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi,(long)local_50._vptr__Sp_counted_base + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VarDuplicated::to_string() const {
    if (left->type() == VarType::Expression) {
        auto expr = left->as<Expr>();
        if (expr->op == ExprOp::Concat) {
            return fmt::format("{{{0}{1}}}", right->to_string(), left->to_string());
        }
    }

    return fmt::format("{{{0}{{{1}}}}}", right->to_string(), left->to_string());
}